

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

packed_view_t *
bwtil::load_packed_view_from_file
          (packed_view_t *__return_storage_ptr__,size_t width,size_t size,FILE *fp)

{
  size_t end;
  size_t begin;
  ulong uVar1;
  ulong end_00;
  ulint x;
  word_type local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  bv::internal::packed_view<std::vector>::packed_view(__return_storage_ptr__,width,size);
  end_00 = size * width;
  if (end_00 < 0x40) {
    end = 0;
  }
  else {
    begin = 0;
    do {
      end = begin + 0x40;
      fread(&local_50,8,1,(FILE *)fp);
      bv::internal::bitview<std::vector>::set(&__return_storage_ptr__->_bits,begin,end,local_50);
      uVar1 = begin + 0x80;
      begin = end;
    } while (uVar1 <= end_00);
  }
  if (end < end_00) {
    fread(&local_50,8,1,(FILE *)fp);
    bv::internal::bitview<std::vector>::set(&__return_storage_ptr__->_bits,end,end_00,local_50);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline packed_view_t load_packed_view_from_file(size_t width, size_t size, FILE * fp){

	 packed_view_t pv = packed_view_t(width,size);
	 load_bitview_from_file(pv.bits(),size*width ,fp);

	 return pv;

	/*if(width<=8)
		return load_packed_view_from_file_T<uint8_t>(width, size, fp);
	if(width<=16)
		return load_packed_view_from_file_T<uint16_t>(width, size, fp);
	if(width<=32)
		return load_packed_view_from_file_T<uint32_t>(width, size, fp);

	return load_packed_view_from_file_T<uint64_t>(width, size, fp);*/

}